

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_destroy(cpool *cpool)

{
  cpool *cpool_local;
  
  if (cpool != (cpool *)0x0) {
    if (cpool->idata != (Curl_easy *)0x0) {
      cpool_close_and_destroy_all(cpool);
      cpool->idata->multi = (Curl_multi *)0x0;
      cpool->idata->share = (Curl_share *)0x0;
      Curl_close(&cpool->idata);
    }
    Curl_hash_destroy(&cpool->dest2bundle);
    cpool->multi = (Curl_multi *)0x0;
  }
  return;
}

Assistant:

void Curl_cpool_destroy(struct cpool *cpool)
{
  if(cpool) {
    if(cpool->idata) {
      cpool_close_and_destroy_all(cpool);
      /* The internal closure handle is special and we need to
       * disconnect it from multi/share before closing it down. */
      cpool->idata->multi = NULL;
      cpool->idata->share = NULL;
      Curl_close(&cpool->idata);
    }
    Curl_hash_destroy(&cpool->dest2bundle);
    cpool->multi = NULL;
  }
}